

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswSim.c
# Opt level: O0

void Ssw_SmlAssignDist1(Ssw_Sml_t *p,uint *pPat)

{
  Vec_Ptr_t *p_00;
  int iVar1;
  int iVar2;
  int iVar3;
  Aig_Obj_t *pAVar4;
  uint *p_01;
  int fUseDist1;
  int nTruePis;
  int Limit;
  int k;
  int i;
  int f;
  Aig_Obj_t *pObj;
  uint *pPat_local;
  Ssw_Sml_t *p_local;
  
  if (0 < p->nFrames) {
    if (p->nFrames == 1) {
      for (Limit = 0; iVar1 = Vec_PtrSize(p->pAig->vCis), Limit < iVar1; Limit = Limit + 1) {
        pAVar4 = (Aig_Obj_t *)Vec_PtrEntry(p->pAig->vCis,Limit);
        iVar1 = Abc_InfoHasBit(pPat,Limit);
        Ssw_SmlObjAssignConst(p,pAVar4,iVar1,0);
      }
      iVar1 = Aig_ManCiNum(p->pAig);
      iVar1 = Abc_MinInt(iVar1,p->nWordsTotal * 0x20 + -1);
      for (Limit = 0; Limit < iVar1; Limit = Limit + 1) {
        pAVar4 = Aig_ManCi(p->pAig,Limit);
        p_01 = Ssw_ObjSim(p,pAVar4->Id);
        Abc_InfoXorBit(p_01,Limit + 1);
      }
    }
    else {
      iVar1 = Aig_ManCiNum(p->pAig);
      iVar2 = Aig_ManRegNum(p->pAig);
      for (k = 0; k < p->nFrames; k = k + 1) {
        for (Limit = 0; iVar3 = Saig_ManPiNum(p->pAig), Limit < iVar3; Limit = Limit + 1) {
          pAVar4 = (Aig_Obj_t *)Vec_PtrEntry(p->pAig->vCis,Limit);
          iVar3 = Abc_InfoHasBit(pPat,(iVar1 - iVar2) * k + Limit);
          Ssw_SmlObjAssignConst(p,pAVar4,iVar3,k);
        }
      }
      nTruePis = 0;
      for (Limit = 0; iVar3 = Saig_ManRegNum(p->pAig), Limit < iVar3; Limit = Limit + 1) {
        p_00 = p->pAig->vCis;
        iVar3 = Saig_ManPiNum(p->pAig);
        pAVar4 = (Aig_Obj_t *)Vec_PtrEntry(p_00,Limit + iVar3);
        iVar3 = Abc_InfoHasBit(pPat,(iVar1 - iVar2) * p->nFrames + nTruePis);
        Ssw_SmlObjAssignConst(p,pAVar4,iVar3,0);
        nTruePis = nTruePis + 1;
      }
    }
    return;
  }
  __assert_fail("p->nFrames > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/ssw/sswSim.c"
                ,0x273,"void Ssw_SmlAssignDist1(Ssw_Sml_t *, unsigned int *)");
}

Assistant:

void Ssw_SmlAssignDist1( Ssw_Sml_t * p, unsigned * pPat )
{
    Aig_Obj_t * pObj;
    int f, i, k, Limit, nTruePis;
    assert( p->nFrames > 0 );
    if ( p->nFrames == 1 )
    {
        // copy the PI info
        Aig_ManForEachCi( p->pAig, pObj, i )
            Ssw_SmlObjAssignConst( p, pObj, Abc_InfoHasBit(pPat, i), 0 );
        // flip one bit
        Limit = Abc_MinInt( Aig_ManCiNum(p->pAig), p->nWordsTotal * 32 - 1 );
        for ( i = 0; i < Limit; i++ )
            Abc_InfoXorBit( Ssw_ObjSim( p, Aig_ManCi(p->pAig,i)->Id ), i+1 );
    }
    else
    {
        int fUseDist1 = 0;

        // copy the PI info for each frame
        nTruePis = Aig_ManCiNum(p->pAig) - Aig_ManRegNum(p->pAig);
        for ( f = 0; f < p->nFrames; f++ )
            Saig_ManForEachPi( p->pAig, pObj, i )
                Ssw_SmlObjAssignConst( p, pObj, Abc_InfoHasBit(pPat, nTruePis * f + i), f );
        // copy the latch info
        k = 0;
        Saig_ManForEachLo( p->pAig, pObj, i )
            Ssw_SmlObjAssignConst( p, pObj, Abc_InfoHasBit(pPat, nTruePis * p->nFrames + k++), 0 );
//        assert( p->pFrames == NULL || nTruePis * p->nFrames + k == Aig_ManCiNum(p->pFrames) );

        // flip one bit of the last frame
        if ( fUseDist1 ) //&& p->nFrames == 2 )
        {
            Limit = Abc_MinInt( nTruePis, p->nWordsFrame * 32 - 1 );
            for ( i = 0; i < Limit; i++ )
                Abc_InfoXorBit( Ssw_ObjSim( p, Aig_ManCi(p->pAig, i)->Id ) + p->nWordsFrame*(p->nFrames-1), i+1 );
        }
    }
}